

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

void findFittest(Generator *g,Pos *pos,uint64_t *fitness,double maxrad,double step)

{
  Pos PVar1;
  uint64_t uVar2;
  double dVar3;
  double dVar4;
  double __x;
  double dVar5;
  undefined8 local_68;
  undefined4 local_38;
  undefined4 uStack_34;
  
  PVar1 = *pos;
  for (dVar5 = step; dVar5 <= maxrad; dVar5 = dVar5 + step) {
    for (__x = 0.0; __x <= 6.283185307179586; __x = __x + step / dVar5) {
      dVar3 = sin(__x);
      dVar4 = cos(__x);
      local_38 = PVar1.x;
      uStack_34 = PVar1.z;
      local_68._0_4_ = (int)(dVar3 * dVar5) + local_38;
      local_68._4_4_ = (int)(dVar4 * dVar5) + uStack_34;
      uVar2 = calcFitness(g,(int)local_68,local_68._4_4_);
      if (uVar2 < *fitness) {
        *pos = local_68;
        *fitness = uVar2;
      }
    }
  }
  return;
}

Assistant:

static
void findFittest(const Generator *g, Pos *pos, uint64_t *fitness, double maxrad, double step)
{
    double rad, ang;
    Pos p = *pos;
    for (rad = step; rad <= maxrad; rad += step)
    {
        for (ang = 0; ang <= PI*2; ang += step/rad)
        {
            int x = p.x + (int)(sin(ang) * rad);
            int z = p.z + (int)(cos(ang) * rad);
            uint64_t fit = calcFitness(g, x, z);
            // Then update pos and fitness if combined total is lower/better
            if (fit < *fitness)
            {
                pos->x = x;
                pos->z = z;
                *fitness = fit;
            }
        }
    }
}